

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O2

wchar_t cmp_desc_prio(void *left,void *right)

{
  ui_entry *entry;
  ui_entry *entry_00;
  char *name;
  long lVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  long in_RAX;
  uint uVar5;
  long lStack_38;
  wchar_t ind;
  
  name = category_for_cmp_desc_prio;
  entry = *left;
  entry_00 = *right;
  if (category_for_cmp_desc_prio != (char *)0x0) {
    lStack_38 = in_RAX;
    wVar2 = ui_entry_search_categories(entry,category_for_cmp_desc_prio,&ind);
    lVar1 = lStack_38;
    wVar4 = ind;
    wVar3 = ui_entry_search_categories(entry_00,name,&ind);
    uVar5 = -(uint)(wVar3 == L'\0') | ind;
    if (lVar1 < 0 || wVar2 == L'\0') {
      if ((int)uVar5 < 0) goto LAB_001d3090;
    }
    else {
      if ((int)uVar5 < 0) {
        return L'\xffffffff';
      }
      wVar2 = entry_00->categories[uVar5].priority;
      wVar4 = entry->categories[(uint)wVar4].priority;
      if (wVar2 < wVar4) {
        return L'\xffffffff';
      }
      if (wVar2 <= wVar4) goto LAB_001d3090;
    }
    return L'\x01';
  }
LAB_001d3090:
  wVar4 = strcmp(entry->name,entry_00->name);
  return wVar4;
}

Assistant:

static int cmp_desc_prio(const void *left, const void *right)
{
	const struct ui_entry *eleft =
		*((const struct ui_entry* const *) left);
	const struct ui_entry *eright =
		*((const struct ui_entry* const *) right);
	int left_ind = -1, right_ind = -1;
	int result;

	if (category_for_cmp_desc_prio) {
		int ind;

		if (ui_entry_search_categories(eleft,
			category_for_cmp_desc_prio, &ind)) {
			left_ind = ind;
		}
		if (ui_entry_search_categories(eright,
			category_for_cmp_desc_prio, &ind)) {
			right_ind = ind;
		}
	}
	if (left_ind >= 0) {
		if (right_ind >= 0) {
			if (eleft->categories[left_ind].priority >
				eright->categories[right_ind].priority) {
				result = -1;
			} else if (eleft->categories[left_ind].priority <
				   eright->categories[right_ind].priority) {
				result = 1;
			} else {
				result = strcmp(eleft->name, eright->name);
			}
		} else {
			/*
			 * right is not in the sort category so it should be
			 * pushed toward the end.
			 */
			result = -1;
		}
	} else if (right_ind >= 0) {
		/*
		 * left is not in the sort category so it should be pushed
		 * towards the end.
		 */
		result = 1;
	} else {
		result = strcmp(eleft->name, eright->name);
	}
	return result;
}